

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O0

void tokenize<v_array<substring>>(char delim,substring s,v_array<substring> *ret,bool allow_empty)

{
  v_array<substring> *in_RDX;
  v_array<substring> *in_RSI;
  char in_DIL;
  byte in_R8B;
  substring final_substring;
  substring temp;
  char *last;
  substring *in_stack_ffffffffffffff98;
  v_array<substring> *this;
  v_array<substring> *local_30;
  v_array<substring> *local_10;
  
  this = in_RDX;
  v_array<substring>::clear(in_RDX);
  local_30 = in_RSI;
  for (local_10 = in_RSI; local_10 != in_RDX;
      local_10 = (v_array<substring> *)((long)&local_10->_begin + 1)) {
    if (*(char *)&local_10->_begin == in_DIL) {
      if (((in_R8B & 1) != 0) || (local_10 != local_30)) {
        v_array<substring>::push_back(this,in_stack_ffffffffffffff98);
      }
      local_30 = (v_array<substring> *)((long)&local_10->_begin + 1);
    }
  }
  if (((in_R8B & 1) != 0) || (local_10 != local_30)) {
    v_array<substring>::push_back(this,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void tokenize(char delim, substring s, ContainerT& ret, bool allow_empty = false)
{
  ret.clear();
  char* last = s.begin;
  for (; s.begin != s.end; s.begin++)
  {
    if (*s.begin == delim)
    {
      if (allow_empty || (s.begin != last))
      {
        substring temp = {last, s.begin};
        ret.push_back(temp);
      }
      last = s.begin + 1;
    }
  }
  if (allow_empty || (s.begin != last))
  {
    substring final_substring = {last, s.begin};
    ret.push_back(final_substring);
  }
}